

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O1

uint __thiscall EIF::GetKey(EIF *this,int keynum)

{
  pointer pEVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  pEVar1 = (this->data).super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->data).
                super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)pEVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 4) * 0x6db6db6db6db6db7;
    uVar4 = ((long)(this->data).
                   super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 4) *
            0x6db6db6db6db6db7;
    uVar2 = 0;
    do {
      uVar5 = uVar2 & 0xffffffff;
      if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
        uVar5 = 0;
      }
      if ((pEVar1[uVar5].type == Key) && (pEVar1[uVar5].field_25.scrollmap == keynum))
      goto LAB_00136238;
      uVar2 = uVar2 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != uVar2);
  }
  uVar2 = 0;
LAB_00136238:
  return (uint)uVar2;
}

Assistant:

unsigned int EIF::GetKey(int keynum) const
{
	for (std::size_t i = 0; i < this->data.size(); ++i)
	{
		if (this->Get(i).type == EIF::Key && this->Get(i).key == keynum)
			return i;
	}

	return 0;
}